

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O0

void quantize_coeff_phase1
               (__m128i *coeff,__m128i *param,int shift,int scale,__m128i *qcoeff,__m128i *dquan,
               __m128i *sign)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  __m128i alVar4;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_f8;
  undefined4 uStack_f4;
  __m128i abs_s;
  __m128i one;
  __m128i zero;
  int iStack_50;
  int iStack_4c;
  __m128i *dquan_local;
  __m128i *qcoeff_local;
  int scale_local;
  int shift_local;
  __m128i *param_local;
  __m128i *coeff_local;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  lVar1 = (*coeff)[0];
  lVar2 = (*coeff)[1];
  dquan_local._0_4_ = (int)lVar1;
  qcoeff_local._0_4_ = (int)lVar2;
  *(uint *)*sign = -(uint)((int)dquan_local < 0);
  *(uint *)((long)*sign + 4) = -(uint)(lVar1 < 0);
  *(uint *)(*sign + 1) = -(uint)((int)qcoeff_local < 0);
  *(uint *)((long)*sign + 0xc) = -(uint)(lVar2 < 0);
  uVar3 = (*sign)[1];
  (*sign)[0] = (*sign)[0] | 0x100000001;
  (*sign)[1] = uVar3 | 0x100000001;
  alVar4 = (__m128i)pabsd((undefined1  [16])*coeff,(undefined1  [16])*coeff);
  *coeff = alVar4;
  local_138 = (int)(*coeff)[0];
  iStack_134 = (int)((ulong)(*coeff)[0] >> 0x20);
  iStack_130 = (int)(*coeff)[1];
  iStack_12c = (int)((ulong)(*coeff)[1] >> 0x20);
  local_148 = (int)(*param)[0];
  iStack_144 = (int)((ulong)(*param)[0] >> 0x20);
  iStack_140 = (int)(*param)[1];
  iStack_13c = (int)((ulong)(*param)[1] >> 0x20);
  *(int *)*qcoeff = local_138 + local_148;
  *(int *)((long)*qcoeff + 4) = iStack_134 + iStack_144;
  *(int *)(*qcoeff + 1) = iStack_130 + iStack_140;
  *(int *)((long)*qcoeff + 0xc) = iStack_12c + iStack_13c;
  uStack_110 = (undefined4)(*qcoeff)[1];
  uStack_10c = (undefined4)((ulong)(*qcoeff)[1] >> 0x20);
  *(undefined4 *)qcoeff[1] = uStack_110;
  *(undefined4 *)((long)qcoeff[1] + 4) = 0;
  *(undefined4 *)(qcoeff[1] + 1) = uStack_10c;
  *(undefined4 *)((long)qcoeff[1] + 0xc) = 0;
  local_f8 = (undefined4)(*qcoeff)[0];
  uStack_f4 = (undefined4)((ulong)(*qcoeff)[0] >> 0x20);
  *(undefined4 *)*qcoeff = local_f8;
  *(undefined4 *)((long)*qcoeff + 4) = 0;
  *(undefined4 *)(*qcoeff + 1) = uStack_f4;
  *(undefined4 *)((long)*qcoeff + 0xc) = 0;
  alVar4 = (__m128i)pmuldq((undefined1  [16])*qcoeff,(undefined1  [16])param[1]);
  *qcoeff = alVar4;
  uVar3 = (*qcoeff)[1];
  (*qcoeff)[0] = (ulong)(*qcoeff)[0] >> (ulong)(uint)shift;
  (*qcoeff)[1] = uVar3 >> (ulong)(uint)shift;
  alVar4 = (__m128i)pmuldq((undefined1  [16])*qcoeff,(undefined1  [16])param[2]);
  *dquan = alVar4;
  uVar3 = (*dquan)[1];
  (*dquan)[0] = (ulong)(*dquan)[0] >> (ulong)(uint)scale;
  (*dquan)[1] = uVar3 >> (ulong)(uint)scale;
  zero[1]._0_4_ = (int)(*coeff)[0];
  zero[1]._4_4_ = (int)((ulong)(*coeff)[0] >> 0x20);
  iStack_50 = (int)(*coeff)[1];
  iStack_4c = (int)((ulong)(*coeff)[1] >> 0x20);
  local_18 = (int)param[3][0];
  iStack_14 = (int)((ulong)param[3][0] >> 0x20);
  iStack_10 = (int)param[3][1];
  iStack_c = (int)((ulong)param[3][1] >> 0x20);
  *(uint *)qcoeff[2] = -(uint)((int)zero[1] << scale + 1 < local_18);
  *(uint *)((long)qcoeff[2] + 4) = -(uint)(zero[1]._4_4_ < iStack_14);
  *(uint *)(qcoeff[2] + 1) = -(uint)(iStack_50 < iStack_10);
  *(uint *)((long)qcoeff[2] + 0xc) = -(uint)(iStack_4c < iStack_c);
  return;
}

Assistant:

static inline void quantize_coeff_phase1(__m128i *coeff, const __m128i *param,
                                         const int shift, const int scale,
                                         __m128i *qcoeff, __m128i *dquan,
                                         __m128i *sign) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);

  *sign = _mm_cmplt_epi32(*coeff, zero);
  *sign = _mm_or_si128(*sign, one);
  *coeff = _mm_abs_epi32(*coeff);

  qcoeff[0] = _mm_add_epi32(*coeff, param[0]);
  qcoeff[1] = _mm_unpackhi_epi32(qcoeff[0], zero);
  qcoeff[0] = _mm_unpacklo_epi32(qcoeff[0], zero);

  qcoeff[0] = _mm_mul_epi32(qcoeff[0], param[1]);
  qcoeff[0] = _mm_srli_epi64(qcoeff[0], shift);
  dquan[0] = _mm_mul_epi32(qcoeff[0], param[2]);
  dquan[0] = _mm_srli_epi64(dquan[0], scale);
  const __m128i abs_s = _mm_slli_epi32(*coeff, 1 + scale);
  qcoeff[2] = _mm_cmplt_epi32(abs_s, param[3]);
}